

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnTableSetExpr
          (BinaryReaderInterp *this,Index table_index)

{
  Result RVar1;
  Location LStack_98;
  Var local_70;
  
  LStack_98.field_1.field_0.line = 0;
  LStack_98.field_1._4_8_ = 0;
  LStack_98.filename.data_ = (char *)0x0;
  LStack_98.filename.size_._0_4_ = 0;
  LStack_98.filename.size_._4_4_ = 0;
  Var::Var(&local_70,table_index,&LStack_98);
  RVar1 = SharedValidator::OnTableSet
                    (&this->validator_,(Location *)(anonymous_namespace)::BinaryReaderInterp::loc,
                     &local_70);
  Var::~Var(&local_70);
  if (RVar1.enum_ != Error) {
    Istream::Emit(this->istream_,TableSet,table_index);
  }
  return (Result)(uint)(RVar1.enum_ == Error);
}

Assistant:

Result BinaryReaderInterp::OnTableSetExpr(Index table_index) {
  CHECK_RESULT(validator_.OnTableSet(loc, Var(table_index)));
  istream_.Emit(Opcode::TableSet, table_index);
  return Result::Ok;
}